

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void compile_limits(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *limits,uint32_t *dest,bool quiet)

{
  uint32_t *puVar1;
  char cVar2;
  pointer pcVar3;
  uint32_t uVar4;
  pointer pbVar5;
  ostream *poVar6;
  long lVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  string limit;
  char local_55;
  undefined4 local_54;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,quiet);
  pbVar5 = (limits->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((limits->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    uVar8 = 0;
    do {
      pcVar3 = pbVar5[uVar8]._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + pbVar5[uVar8]._M_string_length);
      cVar2 = *local_50;
      if ((int)cVar2 - 0x30U < 10) {
        uVar4 = atoi(local_50);
        if ((char)local_54 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"limiting to ",0xc);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,uVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"features for each namespace.",0x1c);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        lVar7 = 0;
        do {
          puVar1 = dest + lVar7;
          *puVar1 = uVar4;
          puVar1[1] = uVar4;
          puVar1[2] = uVar4;
          puVar1[3] = uVar4;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x100);
      }
      else if (local_48 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"You must specify the namespace index before the n",0x31);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      else {
        uVar4 = atoi(local_50 + 1);
        dest[(uint)(int)cVar2] = uVar4;
        if ((char)local_54 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"limiting to ",0xc);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,uVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," for namespaces ",0x10);
          local_55 = *local_50;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_55,1);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar8 = uVar8 + 1;
      pbVar5 = (limits->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(limits->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))
    ;
  }
  return;
}

Assistant:

void compile_limits(vector<string> limits, uint32_t* dest, bool quiet)
{
  for (size_t i = 0; i < limits.size(); i++)
  {
    string limit = limits[i];
    if (isdigit(limit[0]))
    {
      int n = atoi(limit.c_str());
      if (!quiet)
        cerr << "limiting to " << n << "features for each namespace." << endl;
      for (size_t j = 0; j < 256; j++) dest[j] = n;
    }
    else if (limit.size() == 1)
      cout << "You must specify the namespace index before the n" << endl;
    else
    {
      int n = atoi(limit.c_str() + 1);
      dest[(uint32_t)limit[0]] = n;
      if (!quiet)
        cerr << "limiting to " << n << " for namespaces " << limit[0] << endl;
    }
  }
}